

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# player-attack.c
# Opt level: O0

wchar_t melee_damage(monster *mon,object *obj,wchar_t b,wchar_t s)

{
  wchar_t wVar1;
  wchar_t local_28;
  wchar_t local_24;
  wchar_t dmg;
  wchar_t s_local;
  wchar_t b_local;
  object *obj_local;
  monster *mon_local;
  
  if (obj == (object *)0x0) {
    local_28 = L'\x01';
  }
  else {
    local_28 = damroll((uint)obj->dd,(uint)obj->ds);
  }
  local_24 = local_28;
  if (s == L'\0') {
    if (b != L'\0') {
      local_24 = get_monster_brand_multiplier(mon,brands + b,false);
      local_24 = local_24 * local_28;
    }
  }
  else {
    local_24 = slays[s].multiplier * local_28;
  }
  if (obj != (object *)0x0) {
    wVar1 = object_to_dam(obj);
    local_24 = wVar1 + local_24;
  }
  return local_24;
}

Assistant:

static int melee_damage(const struct monster *mon, struct object *obj, int b, int s)
{
	int dmg = (obj) ? damroll(obj->dd, obj->ds) : 1;

	if (s) {
		dmg *= slays[s].multiplier;
	} else if (b) {
		dmg *= get_monster_brand_multiplier(mon, &brands[b], false);
	}

	if (obj) dmg += object_to_dam(obj);

	return dmg;
}